

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

void __thiscall snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,char *ptr)

{
  ulong uVar1;
  long lVar2;
  char cVar3;
  
  if (ptr == (char *)0x0) {
    lVar2 = 1;
    cVar3 = '(';
    do {
      uVar1 = this->insert;
      if (uVar1 < 0x3ff) {
        this->insert = uVar1 + 1;
        (this->buffer)._M_elems[uVar1] = cVar3;
      }
      cVar3 = "(nullptr)"[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
  }
  else {
    do {
      cVar3 = *ptr;
      if (cVar3 == '\0') {
        return;
      }
      uVar1 = this->insert;
      if (uVar1 < 0x3ff) {
        this->insert = uVar1 + 1;
        (this->buffer)._M_elems[uVar1] = cVar3;
      }
      ptr = ptr + 1;
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

void append(const char* ptr)
    {
      if (ptr == nullptr)
      {
        append(nullptr);
        return;
      }

      while (char data = *ptr++)
      {
        append_char(data);
      }
    }